

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IF97.h
# Opt level: O1

double __thiscall IF97::Region3::tau2_d2phi_dtau2(Region3 *this,double T,double rho)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  size_t i;
  long lVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  dVar5 = 0.0;
  lVar4 = 1;
  do {
    uVar1 = (this->Ir).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_start[lVar4];
    dVar6 = 1.0;
    if (uVar1 != 0) {
      uVar3 = -uVar1;
      if (0 < (int)uVar1) {
        uVar3 = uVar1;
      }
      dVar7 = 1.0 / (rho / 322.0);
      if (-1 < (int)uVar1) {
        dVar7 = rho / 322.0;
      }
      dVar6 = 1.0;
      do {
        if ((uVar3 & 1) != 0) {
          dVar6 = dVar6 * dVar7;
        }
        dVar7 = dVar7 * dVar7;
        bVar2 = 1 < uVar3;
        uVar3 = uVar3 >> 1;
      } while (bVar2);
    }
    uVar1 = (this->Jr).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_start[lVar4];
    dVar7 = 1.0;
    if (uVar1 != 0) {
      uVar3 = -uVar1;
      if (0 < (int)uVar1) {
        uVar3 = uVar1;
      }
      dVar8 = 1.0 / (647.096 / T);
      if (-1 < (int)uVar1) {
        dVar8 = 647.096 / T;
      }
      dVar7 = 1.0;
      do {
        if ((uVar3 & 1) != 0) {
          dVar7 = dVar7 * dVar8;
        }
        dVar8 = dVar8 * dVar8;
        bVar2 = 1 < uVar3;
        uVar3 = uVar3 >> 1;
      } while (bVar2);
    }
    dVar5 = dVar5 + (double)(int)(uVar1 - 1) *
                    (double)(int)uVar1 *
                    (this->nr).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar4] * dVar6 * dVar7;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x28);
  return dVar5;
}

Assistant:

double tau2_d2phi_dtau2(double T, double rho) const{
            const double delta = rho/Rhocrit, tau = Tcrit/T;
            double summer = 0;
            for (std::size_t i = 1; i < 40; ++i){
                summer += nr[i]*Jr[i]*(Jr[i]-1)*powi(delta, Ir[i])*powi(tau, Jr[i]);
            }
            return summer;
        }